

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void plot_sprites(tgestate_t *state)

{
  vischar_t *vischar_00;
  uint8_t uVar1;
  int iVar2;
  uint8_t index;
  itemstruct_t *itemstruct;
  vischar_t *vischar;
  byte local_39;
  itemstruct_t *local_38;
  vischar_t *local_30;
  
  iVar2 = get_next_drawable(state,&local_39,&local_30,&local_38);
  if (iVar2 != 0) {
    do {
      vischar_00 = local_30;
      if ((local_39 & 0x40) == 0) {
        iVar2 = setup_vischar_plotting(state,local_30);
        if (iVar2 != 0) {
          render_mask_buffer(state);
          if (state->searchlight_state != 0xff) {
            searchlight_mask_test(state,vischar_00);
          }
          if (vischar_00->width_bytes == '\x03') {
            plot_masked_sprite_16px(state,vischar_00);
          }
          else {
            plot_masked_sprite_24px(state,vischar_00);
          }
        }
      }
      else {
        uVar1 = setup_item_plotting(state,local_38,local_39);
        if (uVar1 != '\0') {
          render_mask_buffer(state);
          plot_masked_sprite_16px_right(state,'\0');
        }
      }
      iVar2 = get_next_drawable(state,&local_39,&local_30,&local_38);
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

void plot_sprites(tgestate_t *state)
{
  uint8_t       index;      /* was A */
  vischar_t    *vischar;    /* was IY */
  itemstruct_t *itemstruct; /* was IY */
  int           found;      /* was Z */
  int           visible;    /* was Z */

  assert(state != NULL);

  for (;;)
  {
    /* This can return a vischar OR an itemstruct, but not both. */
    found = get_next_drawable(state, &index, &vischar, &itemstruct);
    if (!found)
      return;

#ifndef NDEBUG
    if (vischar)
      ASSERT_VISCHAR_VALID(vischar);
    else
      assert(itemstruct != NULL);
#endif

    if ((index & item_FOUND) == 0)
    {
      visible = setup_vischar_plotting(state, vischar);
      if (visible)
      {
        render_mask_buffer(state);
        if (state->searchlight_state != searchlight_STATE_SEARCHING)
          searchlight_mask_test(state, vischar);
        if (vischar->width_bytes != 3)
          plot_masked_sprite_24px(state, vischar);
        else
          plot_masked_sprite_16px(state, vischar);
      }
    }
    else
    {
      visible = setup_item_plotting(state, itemstruct, index);
      if (visible)
      {
        render_mask_buffer(state);
        plot_masked_sprite_16px_x_is_zero(state);
      }
    }
  }
}